

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::addTestIterations
               (DrawTest *test,DrawTestSpec *spec,TestIterationType type)

{
  TestIterationType type_local;
  DrawTestSpec *spec_local;
  DrawTest *test_local;
  
  if (type == TYPE_DRAW_COUNT) {
    spec->primitiveCount = 1;
    addRangeElementsToSpec(spec);
    deqp::gls::DrawTest::addIteration(test,spec,"draw count = 1");
    spec->primitiveCount = 5;
    addRangeElementsToSpec(spec);
    deqp::gls::DrawTest::addIteration(test,spec,"draw count = 5");
    spec->primitiveCount = 0x19;
    addRangeElementsToSpec(spec);
    deqp::gls::DrawTest::addIteration(test,spec,"draw count = 25");
  }
  else if (type == TYPE_INSTANCE_COUNT) {
    spec->instanceCount = 1;
    addRangeElementsToSpec(spec);
    deqp::gls::DrawTest::addIteration(test,spec,"instance count = 1");
    spec->instanceCount = 4;
    addRangeElementsToSpec(spec);
    deqp::gls::DrawTest::addIteration(test,spec,"instance count = 4");
    spec->instanceCount = 0xb;
    addRangeElementsToSpec(spec);
    deqp::gls::DrawTest::addIteration(test,spec,"instance count = 11");
  }
  return;
}

Assistant:

static void addTestIterations (gls::DrawTest* test, gls::DrawTestSpec& spec, TestIterationType type)
{
	if (type == TYPE_DRAW_COUNT)
	{
		spec.primitiveCount = 1;
		test->addIteration(spec, "draw count = 1");

		spec.primitiveCount = 5;
		test->addIteration(spec, "draw count = 5");

		spec.primitiveCount = 25;
		test->addIteration(spec, "draw count = 25");
	}
	else if (type == TYPE_INSTANCE_COUNT)
	{
		spec.instanceCount = 1;
		test->addIteration(spec, "instance count = 1");

		spec.instanceCount = 4;
		test->addIteration(spec, "instance count = 4");

		spec.instanceCount = 11;
		test->addIteration(spec, "instance count = 11");
	}
	else
		DE_ASSERT(false);
}